

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O0

void shape_learn_on_assume(player *p,char *name)

{
  player_shape *ppVar1;
  player_shape *shape;
  wchar_t local_28;
  wchar_t element;
  wchar_t flag;
  bitflag obvious_mask [6];
  bitflag f [6];
  char *name_local;
  player *p_local;
  
  unique0x1000017a = name;
  ppVar1 = lookup_player_shape(name);
  create_obj_flag_mask((bitflag *)&element,L'\x01',3,10);
  flag_copy((bitflag *)((long)&flag + 2),ppVar1->flags,6);
  flag_inter((bitflag *)((long)&flag + 2),(bitflag *)&element,6);
  for (local_28 = flag_next((bitflag *)((long)&flag + 2),6,1); local_28 != L'\0';
      local_28 = flag_next((bitflag *)((long)&flag + 2),6,local_28 + L'\x01')) {
    equip_learn_flag(p,local_28);
  }
  for (shape._4_4_ = L'\0'; shape._4_4_ < L'\x1c'; shape._4_4_ = shape._4_4_ + L'\x01') {
    if ((ppVar1->el_info[shape._4_4_].res_level != 0) &&
       (p->obj_k->el_info[shape._4_4_].res_level == 0)) {
      equip_learn_element(p,shape._4_4_);
    }
  }
  return;
}

Assistant:

void shape_learn_on_assume(struct player *p, const char *name)
{
	bitflag f[OF_SIZE], obvious_mask[OF_SIZE];
	int flag, element;
	struct player_shape *shape = lookup_player_shape(name);

	/* Get the shape's obvious flags */
	create_obj_flag_mask(obvious_mask, true, OFID_WIELD, OFT_MAX);
	of_copy(f, shape->flags);
	of_inter(f, obvious_mask);

	/* Learn flags */
	for (flag = of_next(f, FLAG_START); flag != FLAG_END;
		 flag = of_next(f, flag + 1)) {
		equip_learn_flag(p, flag);
	}

	/* Learn elements */
	for (element = 0; element < ELEM_MAX; element++) {
		if (shape->el_info[element].res_level &&
			!p->obj_k->el_info[element].res_level) {
			equip_learn_element(p, element);
		}
	}
}